

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  ushort uVar1;
  Feature feature;
  bool bVar2;
  uint32_t uVar3;
  uint32_t *ops;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  ulong uVar6;
  allocator local_59;
  string local_58;
  BaseType local_34;
  
  ops = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  if (((this->options).vulkan_semantics == false) &&
     (bVar2 = is_supported_subgroup_op_in_opengl((uint)uVar1,ops), !bVar2)) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"This subgroup operation is only supported in Vulkan semantics.",
               &local_59);
    CompilerError::CompilerError(pCVar5,&local_58);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar3 = get_integer_width_for_instruction(this,i);
  to_signed_basetype(uVar3);
  local_34 = to_unsigned_basetype(uVar3);
  uVar6 = (ulong)(uVar1 - OpGroupNonUniformElect);
  switch(uVar6) {
  case 0:
    feature = SubgroupElect;
    break;
  case 1:
  case 2:
  case 3:
    pSVar4 = Compiler::expression_type(&this->super_Compiler,ops[3]);
    if ((*(int *)&(pSVar4->super_IVariant).field_0xc == 2) && (pSVar4->vecsize == 1)) {
      feature = SubgroupAll_Any_AllEqualBool;
    }
    else {
      feature = SubgroupAllEqualT;
    }
    break;
  case 4:
  case 5:
    feature = SubgroupBroadcast_First;
    break;
  case 6:
    feature = SubgroupBallot;
    break;
  case 7:
switchD_0026f373_caseD_7:
    feature = SubgroupInverseBallot_InclBitCount_ExclBitCout;
    break;
  case 8:
    feature = SubgroupBallotBitExtract;
    break;
  case 9:
    if (ops[3] != 0) {
      if (2 < ops[3]) goto LAB_0026f628;
      goto switchD_0026f373_caseD_7;
    }
    feature = SubgroupBallotBitCount;
    break;
  case 10:
  case 0xb:
    feature = SubgroupBallotFindLSB_MSB;
    break;
  case 0xc:
  case 0xd:
    ::std::__cxx11::string::string((string *)&local_58,"GL_KHR_shader_subgroup_shuffle",&local_59);
    require_extension_internal(this,&local_58);
    goto LAB_0026f476;
  case 0xe:
  case 0xf:
    ::std::__cxx11::string::string
              ((string *)&local_58,"GL_KHR_shader_subgroup_shuffle_relative",&local_59);
    require_extension_internal(this,&local_58);
    goto LAB_0026f476;
  case 0x10:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIAddExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_58);
      goto LAB_0026f476;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_58,"Invalid group operation.",&local_59);
      CompilerError::CompilerError(pCVar5,&local_58);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x11:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFAddExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_58);
      goto LAB_0026f476;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_58,"Invalid group operation.",&local_59);
      CompilerError::CompilerError(pCVar5,&local_58);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x12:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIMulExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_58);
      goto LAB_0026f476;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_58,"Invalid group operation.",&local_59);
      CompilerError::CompilerError(pCVar5,&local_58);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x13:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFMulExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_58);
      goto LAB_0026f476;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_58,"Invalid group operation.",&local_59);
      CompilerError::CompilerError(pCVar5,&local_58);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    if (ops[3] == 3) {
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_58);
    }
    else {
      if (2 < ops[3]) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_58,"Invalid group operation.",&local_59);
        CompilerError::CompilerError(pCVar5,&local_58);
        __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_KHR_shader_subgroup_arithmetic",&local_59);
      require_extension_internal(this,&local_58);
    }
    goto LAB_0026f476;
  case 0x20:
  case 0x21:
    ::std::__cxx11::string::string((string *)&local_58,"GL_KHR_shader_subgroup_quad",&local_59);
    require_extension_internal(this,&local_58);
LAB_0026f476:
    ::std::__cxx11::string::~string((string *)&local_58);
    goto LAB_0026f628;
  default:
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_58,"Invalid opcode for subgroup.",&local_59);
    CompilerError::CompilerError(pCVar5,&local_58);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  request_subgroup_feature(this,feature);
LAB_0026f628:
  uVar3 = Compiler::evaluate_constant_u32(&this->super_Compiler,ops[2]);
  if (uVar3 != 3) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"Only subgroup scope is supported.",&local_59);
    CompilerError::CompilerError(pCVar5,&local_58);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*(code *)(&DAT_003936e4 + *(int *)(&DAT_003936e4 + uVar6 * 4)))();
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op, ops))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBroadcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	// clang-format off
#define GLSL_GROUP_OP(OP)\
	case OpGroupNonUniform##OP:\
	{\
		auto operation = static_cast<GroupOperation>(ops[3]);\
		if (operation == GroupOperationClusteredReduce)\
			require_extension_internal("GL_KHR_shader_subgroup_clustered");\
		else if (operation == GroupOperationReduce)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##Reduce);\
		else if (operation == GroupOperationExclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##ExclusiveScan);\
		else if (operation == GroupOperationInclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##InclusiveScan);\
		else\
			SPIRV_CROSS_THROW("Invalid group operation.");\
		break;\
	}

	GLSL_GROUP_OP(IAdd)
	GLSL_GROUP_OP(FAdd)
	GLSL_GROUP_OP(IMul)
	GLSL_GROUP_OP(FMul)

#undef GLSL_GROUP_OP
	// clang-format on

	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	case OpGroupNonUniformLogicalAnd:
	case OpGroupNonUniformLogicalOr:
	case OpGroupNonUniformLogicalXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
	GLSL_GROUP_OP(LogicalAnd, And)
	GLSL_GROUP_OP(LogicalOr, Or)
	GLSL_GROUP_OP(LogicalXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}